

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

void __thiscall kratos::IfStmt::remove_stmt(IfStmt *this,shared_ptr<kratos::Stmt> *stmt)

{
  element_type *peVar1;
  pointer psVar2;
  element_type *peVar3;
  pointer psVar4;
  bool bVar5;
  
  peVar1 = (this->then_body_).
           super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar4 = (peVar1->super_StmtBlock).stmts_.
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (peVar1->super_StmtBlock).stmts_.
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = psVar4 == psVar2;
  if (!bVar5) {
    peVar3 = (psVar4->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    while (peVar3 != (stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
      psVar4 = psVar4 + 1;
      bVar5 = psVar4 == psVar2;
      if (bVar5) goto LAB_001b098b;
      peVar3 = (psVar4->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    (*(peVar1->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[10])(peVar1,stmt);
    if (!bVar5) {
      return;
    }
  }
LAB_001b098b:
  peVar1 = (this->else_body_).
           super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar4 = (peVar1->super_StmtBlock).stmts_.
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (peVar1->super_StmtBlock).stmts_.
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar4 != psVar2) {
    do {
      if ((psVar4->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
          (stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
        (*(peVar1->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[10])(peVar1,stmt);
        return;
      }
      psVar4 = psVar4 + 1;
    } while (psVar4 != psVar2);
  }
  return;
}

Assistant:

void IfStmt::remove_stmt(const std::shared_ptr<kratos::Stmt> &stmt) {
    for (auto const &s : *then_body_) {
        if (s == stmt) {
            remove_then_stmt(stmt);
            return;
        }
    }
    for (auto const &s : *else_body_) {
        if (s == stmt) {
            remove_else_stmt(stmt);
            return;
        }
    }
}